

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  TestProperty local_60;
  string *local_20;
  string *value_local;
  string *key_local;
  UnitTest *this_local;
  
  this_00 = this->impl_;
  local_20 = value;
  value_local = key;
  key_local = (string *)this;
  TestProperty::TestProperty(&local_60,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,&local_60);
  TestProperty::~TestProperty(&local_60);
  return;
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}